

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)1>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)1>_>_>
 __thiscall
wabt::MakeUnique<wabt::LoadStoreExpr<(wabt::ExprType)1>,wabt::Opcode&,int,unsigned_long&>
          (wabt *this,Opcode *args,int *args_1,unsigned_long *args_2)

{
  Address offset;
  unsigned_long uVar1;
  LoadStoreExpr<(wabt::ExprType)1> *this_00;
  Location local_50;
  Opcode local_2c;
  Address *local_28;
  unsigned_long *args_local_2;
  int *args_local_1;
  Opcode *args_local;
  
  local_28 = args_2;
  args_local_2 = (unsigned_long *)args_1;
  args_local_1 = (int *)args;
  args_local = (Opcode *)this;
  this_00 = (LoadStoreExpr<(wabt::ExprType)1> *)operator_new(0x50);
  local_2c.enum_ = *args_local_1;
  uVar1 = *args_local_2;
  offset = *local_28;
  Location::Location(&local_50);
  LoadStoreExpr<(wabt::ExprType)1>::LoadStoreExpr
            (this_00,local_2c,(long)(int)uVar1,offset,&local_50);
  std::
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)1>,std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)1>>>
  ::unique_ptr<std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)1>>,void>
            ((unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)1>,std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)1>>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::LoadStoreExpr<(wabt::ExprType)1>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)1>_>,_true,_true>
          )(__uniq_ptr_data<wabt::LoadStoreExpr<(wabt::ExprType)1>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)1>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}